

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPT.cpp
# Opt level: O3

void __thiscall OpenMD::NPT::moveB(NPT *this)

{
  undefined8 *puVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  pointer ppSVar5;
  pointer pVVar6;
  pointer pVVar7;
  Snapshot *pSVar8;
  RealType RVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  Thermo *this_00;
  uint i_2;
  Molecule *pMVar12;
  undefined1 *puVar13;
  uint i_1;
  long lVar14;
  long lVar15;
  StuntDouble *pSVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  pointer ppSVar20;
  uint uVar21;
  pair<double,_double> pVar22;
  Vector<double,_3U> result_3;
  MoleculeIterator i;
  Vector<double,_3U> result_2;
  Vector<double,_3U> result;
  Vector<double,_3U> result_1;
  Vector3d sc;
  Vector3d ji;
  Vector3d Tb;
  Vector3d local_188;
  MoleculeIterator local_168;
  pair<double,_double> *local_160;
  double local_158 [4];
  double local_138 [4];
  double local_118 [4];
  Thermo *local_f8;
  double local_f0;
  ulong local_e8;
  double local_e0;
  double local_d8 [4];
  double local_b8;
  double dStack_b0;
  double local_a8;
  Vector3d local_98;
  double local_78;
  undefined8 uStack_70;
  double local_68 [4];
  double local_48;
  double dStack_40;
  double local_38;
  
  iVar17 = 0;
  local_168._M_node = (_Base_ptr)0x0;
  local_98.super_Vector<double,_3U>.data_[2] = 0.0;
  local_98.super_Vector<double,_3U>.data_[0] = 0.0;
  local_98.super_Vector<double,_3U>.data_[1] = 0.0;
  local_a8 = 0.0;
  local_b8 = 0.0;
  dStack_b0 = 0.0;
  local_d8[2] = 0.0;
  local_d8[0] = 0.0;
  local_d8[1] = 0.0;
  pVar22 = Snapshot::getThermostat((this->super_VelocityVerletIntegrator).super_Integrator.snap);
  local_f0 = pVar22.first;
  (this->thermostat).first = local_f0;
  (this->thermostat).second = pVar22.second;
  (*(this->super_VelocityVerletIntegrator).super_Integrator._vptr_Integrator[0x18])(this);
  pMVar12 = SimInfo::beginMolecule
                      ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_168);
  if (pMVar12 != (Molecule *)0x0) {
    do {
      ppSVar20 = (pMVar12->integrableObjects_).
                 super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppSVar5 = (pMVar12->integrableObjects_).
                super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if ((ppSVar20 != ppSVar5) && (pSVar16 = *ppSVar20, pSVar16 != (StuntDouble *)0x0)) {
        pVVar6 = (this->oldVel).
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pVVar7 = (this->oldJi).
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar15 = (long)iVar17 * 0x18;
        do {
          iVar17 = iVar17 + 1;
          ppSVar20 = ppSVar20 + 1;
          pSVar8 = pSVar16->snapshotMan_->currentSnapshot_;
          lVar18 = (long)pSVar16->localIndex_;
          lVar14 = *(long *)((long)&(pSVar8->atomData).velocity.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + pSVar16->storage_);
          puVar1 = (undefined8 *)(lVar14 + lVar18 * 0x18);
          uVar10 = *puVar1;
          uVar11 = puVar1[1];
          *(undefined8 *)((long)(pVVar6->super_Vector<double,_3U>).data_ + lVar15 + 0x10) =
               *(undefined8 *)(lVar14 + 0x10 + lVar18 * 0x18);
          puVar1 = (undefined8 *)((long)(pVVar6->super_Vector<double,_3U>).data_ + lVar15);
          *puVar1 = uVar10;
          puVar1[1] = uVar11;
          if (pSVar16->objType_ - otDAtom < 2) {
            lVar14 = *(long *)((long)&(pSVar8->atomData).angularMomentum.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + pSVar16->storage_)
            ;
            puVar1 = (undefined8 *)(lVar14 + lVar18 * 0x18);
            uVar10 = *puVar1;
            uVar11 = puVar1[1];
            *(undefined8 *)((long)(pVVar7->super_Vector<double,_3U>).data_ + lVar15 + 0x10) =
                 *(undefined8 *)(lVar14 + 0x10 + lVar18 * 0x18);
            puVar1 = (undefined8 *)((long)(pVVar7->super_Vector<double,_3U>).data_ + lVar15);
            *puVar1 = uVar10;
            puVar1[1] = uVar11;
          }
          if (ppSVar20 == ppSVar5) break;
          pSVar16 = *ppSVar20;
          lVar15 = lVar15 + 0x18;
        } while (pSVar16 != (StuntDouble *)0x0);
      }
      pMVar12 = SimInfo::nextMolecule
                          ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_168)
      ;
    } while (pMVar12 != (Molecule *)0x0);
  }
  local_160 = &this->thermostat;
  local_f8 = &(this->super_VelocityVerletIntegrator).super_Integrator.thermo;
  RVar9 = Thermo::getVolume(local_f8);
  this->instaVol = RVar9;
  if (0 < this->maxIterNum_) {
    uVar19 = 0;
    do {
      this_00 = local_f8;
      local_e8 = uVar19;
      RVar9 = Thermo::getTemperature(local_f8);
      this->instaTemp = RVar9;
      RVar9 = Thermo::getPressure(this_00);
      this->instaPress = RVar9;
      local_78 = (this->thermostat).first;
      uStack_70 = 0;
      (this->thermostat).first =
           ((this->instaTemp / this->targetTemp + -1.0) *
           (this->super_VelocityVerletIntegrator).super_Integrator.dt2) / this->tt2 + local_f0;
      (*(this->super_VelocityVerletIntegrator).super_Integrator._vptr_Integrator[0x16])(this);
      (*(this->super_VelocityVerletIntegrator).super_Integrator._vptr_Integrator[0x13])(this);
      pMVar12 = SimInfo::beginMolecule
                          ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_168)
      ;
      if (pMVar12 != (Molecule *)0x0) {
        uVar19 = 0;
        do {
          ppSVar20 = (pMVar12->integrableObjects_).
                     super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if ((ppSVar20 !=
               (pMVar12->integrableObjects_).
               super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
               _M_impl.super__Vector_impl_data._M_finish) &&
             (pSVar16 = *ppSVar20, pSVar16 != (StuntDouble *)0x0)) {
            uVar19 = (ulong)(int)uVar19;
            lVar15 = uVar19 * 0x18;
            do {
              lVar14 = *(long *)((long)&(pSVar16->snapshotMan_->currentSnapshot_->atomData).force.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                pSVar16->storage_);
              local_68[2] = *(double *)(lVar14 + 0x10 + (long)pSVar16->localIndex_ * 0x18);
              pdVar2 = (double *)(lVar14 + (long)pSVar16->localIndex_ * 0x18);
              local_68[0] = *pdVar2;
              local_68[1] = pdVar2[1];
              local_e0 = pSVar16->mass_;
              (*(this->super_VelocityVerletIntegrator).super_Integrator._vptr_Integrator[0x11])
                        (this,local_d8,uVar19 & 0xffffffff);
              pVVar6 = (this->oldVel).
                       super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              dVar3 = (this->super_VelocityVerletIntegrator).super_Integrator.dt2;
              local_138[0] = 0.0;
              local_138[1] = 0.0;
              local_138[2] = 0.0;
              lVar14 = 0;
              do {
                local_138[lVar14] = local_68[lVar14] * ((dVar3 * 0.0004184) / local_e0);
                lVar14 = lVar14 + 1;
              } while (lVar14 != 3);
              local_118[0] = 0.0;
              local_118[1] = 0.0;
              local_118[2] = 0.0;
              lVar14 = 0;
              do {
                local_118[lVar14] =
                     *(double *)
                      ((long)(pVVar6->super_Vector<double,_3U>).data_ + lVar14 * 8 + lVar15) +
                     local_138[lVar14];
                lVar14 = lVar14 + 1;
              } while (lVar14 != 3);
              local_158[0] = 0.0;
              local_158[1] = 0.0;
              local_158[2] = 0.0;
              lVar14 = 0;
              do {
                local_158[lVar14] = local_d8[lVar14] * dVar3;
                lVar14 = lVar14 + 1;
              } while (lVar14 != 3);
              local_188.super_Vector<double,_3U>.data_[0] = 0.0;
              local_188.super_Vector<double,_3U>.data_[1] = 0.0;
              local_188.super_Vector<double,_3U>.data_[2] = 0.0;
              lVar14 = 0;
              do {
                local_188.super_Vector<double,_3U>.data_[lVar14] =
                     local_118[lVar14] - local_158[lVar14];
                lVar14 = lVar14 + 1;
              } while (lVar14 != 3);
              local_38 = local_188.super_Vector<double,_3U>.data_[2];
              local_48 = local_188.super_Vector<double,_3U>.data_[0];
              dStack_40 = local_188.super_Vector<double,_3U>.data_[1];
              pSVar8 = pSVar16->snapshotMan_->currentSnapshot_;
              lVar18 = (long)pSVar16->localIndex_;
              lVar14 = *(long *)((long)&(pSVar8->atomData).velocity.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                pSVar16->storage_);
              *(double *)(lVar14 + 0x10 + lVar18 * 0x18) =
                   local_188.super_Vector<double,_3U>.data_[2];
              pdVar2 = (double *)(lVar14 + lVar18 * 0x18);
              *pdVar2 = local_188.super_Vector<double,_3U>.data_[0];
              pdVar2[1] = local_188.super_Vector<double,_3U>.data_[1];
              if (pSVar16->objType_ - otDAtom < 2) {
                puVar13 = (undefined1 *)
                          (lVar18 * 0x18 +
                          *(long *)((long)&(pSVar8->atomData).torque.
                                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start +
                                   pSVar16->storage_));
                local_188.super_Vector<double,_3U>.data_[0] = 0.0;
                local_188.super_Vector<double,_3U>.data_[1] = 0.0;
                local_188.super_Vector<double,_3U>.data_[2] = 0.0;
                if ((Vector3d *)puVar13 != &local_188) {
                  lVar14 = 0;
                  do {
                    local_188.super_Vector<double,_3U>.data_[lVar14] =
                         *(double *)(puVar13 + lVar14 * 8);
                    lVar14 = lVar14 + 1;
                  } while (lVar14 != 3);
                }
                StuntDouble::lab2Body(&local_98,pSVar16,&local_188);
                pVVar6 = (this->oldJi).
                         super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                dVar3 = (this->super_VelocityVerletIntegrator).super_Integrator.dt2;
                local_138[0] = 0.0;
                local_138[1] = 0.0;
                local_138[2] = 0.0;
                lVar14 = 0;
                do {
                  local_138[lVar14] =
                       local_98.super_Vector<double,_3U>.data_[lVar14] * dVar3 * 0.0004184;
                  lVar14 = lVar14 + 1;
                } while (lVar14 != 3);
                local_118[0] = 0.0;
                local_118[1] = 0.0;
                local_118[2] = 0.0;
                lVar14 = 0;
                do {
                  local_118[lVar14] =
                       *(double *)
                        ((long)(pVVar6->super_Vector<double,_3U>).data_ + lVar14 * 8 + lVar15) +
                       local_138[lVar14];
                  lVar14 = lVar14 + 1;
                } while (lVar14 != 3);
                dVar4 = local_160->first;
                local_158[0] = 0.0;
                local_158[1] = 0.0;
                local_158[2] = 0.0;
                lVar14 = 0;
                do {
                  local_158[lVar14] =
                       *(double *)
                        ((long)(pVVar6->super_Vector<double,_3U>).data_ + lVar14 * 8 + lVar15) *
                       dVar3 * dVar4;
                  lVar14 = lVar14 + 1;
                } while (lVar14 != 3);
                local_188.super_Vector<double,_3U>.data_[0] = 0.0;
                local_188.super_Vector<double,_3U>.data_[1] = 0.0;
                local_188.super_Vector<double,_3U>.data_[2] = 0.0;
                lVar14 = 0;
                do {
                  local_188.super_Vector<double,_3U>.data_[lVar14] =
                       local_118[lVar14] - local_158[lVar14];
                  lVar14 = lVar14 + 1;
                } while (lVar14 != 3);
                local_a8 = local_188.super_Vector<double,_3U>.data_[2];
                local_b8 = local_188.super_Vector<double,_3U>.data_[0];
                dStack_b0 = local_188.super_Vector<double,_3U>.data_[1];
                iVar17 = pSVar16->localIndex_;
                lVar14 = *(long *)((long)&(pSVar16->snapshotMan_->currentSnapshot_->atomData).
                                          angularMomentum.
                                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start +
                                  pSVar16->storage_);
                *(double *)(lVar14 + 0x10 + (long)iVar17 * 0x18) =
                     local_188.super_Vector<double,_3U>.data_[2];
                pdVar2 = (double *)(lVar14 + (long)iVar17 * 0x18);
                *pdVar2 = local_188.super_Vector<double,_3U>.data_[0];
                pdVar2[1] = local_188.super_Vector<double,_3U>.data_[1];
              }
              uVar19 = uVar19 + 1;
              ppSVar20 = ppSVar20 + 1;
              if (ppSVar20 ==
                  (pMVar12->integrableObjects_).
                  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish) break;
              pSVar16 = *ppSVar20;
              lVar15 = lVar15 + 0x18;
            } while (pSVar16 != (StuntDouble *)0x0);
          }
          pMVar12 = SimInfo::nextMolecule
                              ((this->super_VelocityVerletIntegrator).super_Integrator.info_,
                               &local_168);
        } while (pMVar12 != (Molecule *)0x0);
      }
      Rattle::constraintB((this->super_VelocityVerletIntegrator).super_Integrator.rattle_);
      uVar19 = local_e8;
    } while (((this->chiTolerance < ABS(local_78 - (this->thermostat).first)) ||
             (iVar17 = (*(this->super_VelocityVerletIntegrator).super_Integrator._vptr_Integrator
                         [0x14])(this), (char)iVar17 == '\0')) &&
            (uVar21 = (int)uVar19 + 1, uVar19 = (ulong)uVar21, (int)uVar21 < this->maxIterNum_));
  }
  (this->thermostat).second =
       (this->super_VelocityVerletIntegrator).super_Integrator.dt2 * (this->thermostat).first +
       (this->thermostat).second;
  Snapshot::setThermostat((this->super_VelocityVerletIntegrator).super_Integrator.snap,local_160);
  (*((this->super_VelocityVerletIntegrator).super_Integrator.flucQ_)->
    _vptr_FluctuatingChargePropagator[6])();
  (*(this->super_VelocityVerletIntegrator).super_Integrator._vptr_Integrator[0x19])(this);
  return;
}

Assistant:

void NPT::moveB(void) {
    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    Molecule* mol;
    StuntDouble* sd;
    int index;
    Vector3d Tb;
    Vector3d ji;
    Vector3d sc;
    Vector3d vel;
    Vector3d frc;
    RealType mass;

    thermostat      = snap->getThermostat();
    RealType oldChi = thermostat.first;
    RealType prevChi;

    loadEta();

    // save velocity and angular momentum
    index = 0;
    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        oldVel[index] = sd->getVel();

        if (sd->isDirectional()) oldJi[index] = sd->getJ();

        ++index;
      }
    }

    // do the iteration:
    instaVol = thermo.getVolume();

    for (int k = 0; k < maxIterNum_; k++) {
      instaTemp  = thermo.getTemperature();
      instaPress = thermo.getPressure();

      // evolve chi another half step using the temperature at t + dt/2
      prevChi          = thermostat.first;
      thermostat.first = oldChi + dt2 * (instaTemp / targetTemp - 1.0) / tt2;

      // evolve eta
      this->evolveEtaB();
      this->calcVelScale();

      index = 0;
      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (sd = mol->beginIntegrableObject(j); sd != NULL;
             sd = mol->nextIntegrableObject(j)) {
          frc  = sd->getFrc();
          mass = sd->getMass();

          getVelScaleB(sc, index);

          // velocity half step
          vel = oldVel[index] + dt2 * Constants::energyConvert / mass * frc -
                dt2 * sc;

          sd->setVel(vel);

          if (sd->isDirectional()) {
            // get and convert the torque to body frame
            Tb = sd->lab2Body(sd->getTrq());

            ji = oldJi[index] + dt2 * Constants::energyConvert * Tb -
                 dt2 * thermostat.first * oldJi[index];

            sd->setJ(ji);
          }

          ++index;
        }
      }

      rattle_->constraintB();

      if ((fabs(prevChi - thermostat.first) <= chiTolerance) &&
          this->etaConverged())
        break;
    }

    // calculate integral of chidt
    thermostat.second += dt2 * thermostat.first;

    snap->setThermostat(thermostat);

    flucQ_->moveB();
    saveEta();
  }